

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O1

void __thiscall adios2::profiling::Timer::~Timer(Timer *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_Details)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_Details).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_LocalTimeDate)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_LocalTimeDate).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_Process)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_Process).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Timer() = default;